

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O1

void nmq_start(NMQ *q)

{
  uint uVar1;
  uint32_t uVar2;
  dlnode **ppdVar3;
  uint32_t *__s;
  dlnode *node;
  uint8_t uVar4;
  size_t sVar5;
  
  if (q->inited != '\0') {
    return;
  }
  q->inited = '\x01';
  if (q->steady_on == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint32_t)
            (long)((double)q->MTU *
                  ((double)((uint)q->flush_interval * q->MAX_SND_BUF_NUM) / 1000.0));
  }
  q->BYTES_PER_FLUSH = uVar2;
  sVar5 = (ulong)q->MAX_SND_BUF_NUM << 3;
  ppdVar3 = (dlnode **)malloc(sVar5);
  if (ppdVar3 != (dlnode **)0x0) {
    q->snd_sn_to_node = ppdVar3;
    memset(ppdVar3,0,sVar5);
    sVar5 = (ulong)q->MAX_RCV_BUF_NUM << 3;
    ppdVar3 = (dlnode **)malloc(sVar5);
    if (ppdVar3 != (dlnode **)0x0) {
      q->rcv_sn_to_node = ppdVar3;
      memset(ppdVar3,0,sVar5);
      sVar5 = (ulong)q->ackmaxnum << 3;
      __s = (uint32_t *)malloc(sVar5);
      if (__s != (uint32_t *)0x0) {
        q->acklist = __s;
        memset(__s,0,sVar5);
        uVar1 = q->MSS;
        uVar4 = (q->pool).CAP;
        dlist_init(&(q->pool).seg_list);
        (q->pool).left = uVar4;
        (q->pool).CAP = uVar4;
        (q->pool).MTU = uVar1;
        if (uVar4 == '\0') {
          return;
        }
        while (node = (dlnode *)malloc((ulong)uVar1 + 0x40), node != (dlnode *)0x0) {
          node[3].prev = (dlist_s *)0x0;
          node[3].next = (dlist_s *)0x0;
          node[2].prev = (dlist_s *)0x0;
          node[2].next = (dlist_s *)0x0;
          node[1].prev = (dlist_s *)0x0;
          node[1].next = (dlist_s *)0x0;
          node->prev = (dlist_s *)0x0;
          node->next = (dlist_s *)0x0;
          dlist_add_tail(&(q->pool).seg_list,node);
          uVar4 = uVar4 + 0xff;
          if (uVar4 == '\0') {
            return;
          }
        }
      }
    }
  }
  abort();
}

Assistant:

void nmq_start(NMQ *q) {
    if (!q->inited) {
        q->inited = 1;
        init_steady_state(q);
        allocate_mem(q);
    }
}